

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

MIR_type_t get_mir_type(c2m_ctx_t c2m_ctx,type *type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  MIR_type_t MVar4;
  mir_size_t mVar5;
  
  mVar5 = raw_type_size(c2m_ctx,type);
  iVar1 = floating_type_p(type);
  iVar2 = signed_integer_type_p(type);
  iVar3 = scalar_type_p(type);
  if (iVar3 == 0) {
    MVar4 = MIR_T_UNDEF;
  }
  else {
    if (2 < type->mode - TM_BASIC) {
      __assert_fail("type->mode == TM_BASIC || type->mode == TM_PTR || type->mode == TM_ENUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2831,"MIR_type_t get_mir_type(c2m_ctx_t, struct type *)");
    }
    if (iVar1 == 0) {
      if ((8 < mVar5) || ((0x117UL >> (mVar5 & 0x3f) & 1) == 0)) {
        __assert_fail("size <= 2 || size == 4 || size == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2836,"MIR_type_t get_mir_type(c2m_ctx_t, struct type *)");
      }
      if (iVar2 == 0) {
        if (mVar5 == 1) {
          MVar4 = MIR_T_U8;
        }
        else if (mVar5 == 2) {
          MVar4 = MIR_T_U16;
        }
        else {
          MVar4 = (mVar5 != 4) + 5 + (uint)(mVar5 != 4);
        }
      }
      else if (mVar5 == 1) {
        MVar4 = MIR_T_I8;
      }
      else if (mVar5 == 2) {
        MVar4 = MIR_T_I16;
      }
      else {
        MVar4 = (mVar5 != 4) + 4 + (uint)(mVar5 != 4);
      }
    }
    else if (mVar5 == 4) {
      MVar4 = MIR_T_F;
    }
    else {
      if ((mVar5 != 8) && (mVar5 != 0x10)) {
        __assert_fail("size == 4 || size == 8 || size == sizeof (mir_ldouble)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2833,"MIR_type_t get_mir_type(c2m_ctx_t, struct type *)");
      }
      MVar4 = (mVar5 != 8) + MIR_T_D;
    }
  }
  return MVar4;
}

Assistant:

static MIR_type_t get_mir_type (c2m_ctx_t c2m_ctx, struct type *type) {
  size_t size = raw_type_size (c2m_ctx, type);
  int int_p = !floating_type_p (type), signed_p = signed_integer_type_p (type);

  if (!scalar_type_p (type)) return MIR_T_UNDEF;
  assert (type->mode == TM_BASIC || type->mode == TM_PTR || type->mode == TM_ENUM);
  if (!int_p) {
    assert (size == 4 || size == 8 || size == sizeof (mir_ldouble));
    return size == 4 ? MIR_T_F : size == 8 ? MIR_T_D : MIR_T_LD;
  }
  assert (size <= 2 || size == 4 || size == 8);
  if (signed_p) return get_int_mir_type (size);
  return size == 1 ? MIR_T_U8 : size == 2 ? MIR_T_U16 : size == 4 ? MIR_T_U32 : MIR_T_U64;
}